

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int cfft2b_(int *ldim,int *l,int *m,fft_complex_t *c__,double *wsave,int *lensav,double *work,
           int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *inc;
  int iVar5;
  double dVar6;
  double dVar7;
  int i__1;
  int ier1;
  int i__3;
  int i__2;
  int *local_50;
  double *local_48;
  double *local_40;
  int *local_38;
  
  *ier = 0;
  iVar1 = *l;
  iVar5 = 5;
  if (iVar1 <= *ldim) {
    iVar2 = *lensav;
    local_50 = m;
    local_38 = ldim;
    dVar6 = log((double)iVar1);
    iVar3 = *local_50;
    dVar7 = log((double)iVar3);
    iVar5 = 2;
    if ((int)(dVar7 / 0.6931471805599453) + (int)(dVar6 / 0.6931471805599453) + (iVar1 + iVar3) * 2
        + 8 <= iVar2) {
      iVar1 = *l * 2;
      iVar5 = 3;
      if (*local_50 * iVar1 <= *lenwrk) {
        local_40 = wsave + -1;
        local_48 = wsave;
        dVar6 = log((double)*l);
        inc = local_38;
        piVar4 = local_50;
        iVar5 = *local_50;
        i__1 = (iVar5 + -1) * *local_38 + *l;
        dVar7 = log((double)iVar5);
        i__2 = (int)(dVar7 / 0.6931471805599453) + iVar5 * 2 + 4;
        i__3 = *l * *piVar4 * 2;
        cfftmb_(l,&c__1,piVar4,inc,c__,&i__1,
                local_40 + (long)(iVar1 + (int)(dVar6 / 0.6931471805599453)) + 3,&i__2,work,&i__3,
                &ier1);
        piVar4 = local_50;
        iVar5 = 0x14;
        if (ier1 == 0) {
          iVar1 = *l;
          i__1 = (*local_50 + -1) * *inc + iVar1;
          dVar6 = log((double)iVar1);
          i__2 = (int)(dVar6 / 0.6931471805599453) + iVar1 * 2 + 4;
          i__3 = *piVar4 * *l * 2;
          cfftmb_(piVar4,inc,l,&c__1,c__,&i__1,local_48,&i__2,work,&i__3,&ier1);
          if (ier1 == 0) {
            return 0;
          }
        }
      }
    }
  }
  *ier = iVar5;
  return 0;
}

Assistant:

int cfft2b_(int *ldim, int *l, int *m, complex *
	c__, fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk,
	int *ier)
{
    /* System generated locals */
    int c_dim1, c_offset, i__1, i__2, i__3;


    /* Local variables */
     int iw, ier1;
    extern /* Subroutine */ int cfftmb_(int *, int *, int *,
	    int *, complex *, int *, fft_real_t *, int *, fft_real_t *,
	    int *, int *), xerfft_(char *, int *, ftnlen);


/* Initialize error return */

    /* Parameter adjustments */
    c_dim1 = *ldim;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*l > *ldim) {
	*ier = 5;
	////xerfft_("CFFT2B", &c_n2, (ftnlen)6);
	goto L100;
    } else if (*lensav < (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0))
	    + (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 8) {
	*ier = 2;
	////xerfft_("CFFT2B", &c__6, (ftnlen)6);
	goto L100;
    } else if (*lenwrk < (*l << 1) * *m) {
	*ier = 3;
	////xerfft_("CFFT2B", &c__8, (ftnlen)6);
	goto L100;
    }

/* Transform X lines of C array */
    iw = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 3;
    i__1 = *l - 1 + *ldim * (*m - 1) + 1;
    i__2 = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    i__3 = (*l << 1) * *m;
    cfftmb_(l, &c__1, m, ldim, &c__[c_offset], &i__1, &wsave[iw], &i__2, &
	    work[1], &i__3, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	////xerfft_("CFFT2B", &c_n5, (ftnlen)6);
	goto L100;
    }

/* Transform Y lines of C array */
    iw = 1;
    i__1 = (*m - 1) * *ldim + *l;
    i__2 = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    i__3 = (*m << 1) * *l;
    cfftmb_(m, ldim, l, &c__1, &c__[c_offset], &i__1, &wsave[iw], &i__2, &
	    work[1], &i__3, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	////xerfft_("CFFT2B", &c_n5, (ftnlen)6);
    }

L100:
    return 0;
}